

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store_array_binary(XMLWriter *this,char *name,avector<Vec3ff> *vec)

{
  undefined1 *puVar1;
  size_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  
  std::istream::tellg();
  if (this->ident != 0) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->ident);
  }
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"<",1);
  if (name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)puVar1 + -0x18) + (int)puVar1);
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ofs=\"",6);
  poVar3 = std::ostream::_M_insert<long>((long)puVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" size=\"",8);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"/>",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (vec->size_active != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      std::ostream::write(&this->field_0x220,(long)&vec->items->field_0 + lVar5);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < vec->size_active);
  }
  return;
}

Assistant:

void XMLWriter::store_array_binary(const char* name, const avector<Vec3ff>& vec)
  {
    std::streampos offset = bin.tellg();
    tab(); xml << "<" << name << " ofs=\"" << offset << "\" size=\"" << vec.size() << "\"/>" << std::endl;
    for (size_t i=0; i<vec.size(); i++) bin.write((char*)&vec[i],sizeof(Vec3ff));
  }